

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar3 -
                  (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    lineInfo.file = (char *)((ulong)lineInfo.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
      printHeaderString(this,&pSVar3->name,2);
    }
    Colour::~Colour((Colour *)&lineInfo);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar3[-1].lineInfo.file;
  lineInfo.line = pSVar3[-1].lineInfo.line;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000027f8a0 = 0x2d2d2d2d2d2d2d;
    uRam000000000027f8a7._0_1_ = '-';
    uRam000000000027f8a7._1_1_ = '-';
    uRam000000000027f8a7._2_1_ = '-';
    uRam000000000027f8a7._3_1_ = '-';
    uRam000000000027f8a7._4_1_ = '-';
    uRam000000000027f8a7._5_1_ = '-';
    uRam000000000027f8a7._6_1_ = '-';
    uRam000000000027f8a7._7_1_ = '-';
    DAT_0027f890 = '-';
    DAT_0027f890_1._0_1_ = '-';
    DAT_0027f890_1._1_1_ = '-';
    DAT_0027f890_1._2_1_ = '-';
    DAT_0027f890_1._3_1_ = '-';
    DAT_0027f890_1._4_1_ = '-';
    DAT_0027f890_1._5_1_ = '-';
    DAT_0027f890_1._6_1_ = '-';
    uRam000000000027f898 = 0x2d2d2d2d2d2d2d;
    DAT_0027f89f = 0x2d;
    DAT_0027f880 = '-';
    DAT_0027f880_1._0_1_ = '-';
    DAT_0027f880_1._1_1_ = '-';
    DAT_0027f880_1._2_1_ = '-';
    DAT_0027f880_1._3_1_ = '-';
    DAT_0027f880_1._4_1_ = '-';
    DAT_0027f880_1._5_1_ = '-';
    DAT_0027f880_1._6_1_ = '-';
    uRam000000000027f888._0_1_ = '-';
    uRam000000000027f888._1_1_ = '-';
    uRam000000000027f888._2_1_ = '-';
    uRam000000000027f888._3_1_ = '-';
    uRam000000000027f888._4_1_ = '-';
    uRam000000000027f888._5_1_ = '-';
    uRam000000000027f888._6_1_ = '-';
    uRam000000000027f888._7_1_ = '-';
    DAT_0027f870 = '-';
    DAT_0027f870_1._0_1_ = '-';
    DAT_0027f870_1._1_1_ = '-';
    DAT_0027f870_1._2_1_ = '-';
    DAT_0027f870_1._3_1_ = '-';
    DAT_0027f870_1._4_1_ = '-';
    DAT_0027f870_1._5_1_ = '-';
    DAT_0027f870_1._6_1_ = '-';
    uRam000000000027f878._0_1_ = '-';
    uRam000000000027f878._1_1_ = '-';
    uRam000000000027f878._2_1_ = '-';
    uRam000000000027f878._3_1_ = '-';
    uRam000000000027f878._4_1_ = '-';
    uRam000000000027f878._5_1_ = '-';
    uRam000000000027f878._6_1_ = '-';
    uRam000000000027f878._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000027f868._0_1_ = '-';
    uRam000000000027f868._1_1_ = '-';
    uRam000000000027f868._2_1_ = '-';
    uRam000000000027f868._3_1_ = '-';
    uRam000000000027f868._4_1_ = '-';
    uRam000000000027f868._5_1_ = '-';
    uRam000000000027f868._6_1_ = '-';
    uRam000000000027f868._7_1_ = '-';
    DAT_0027f8af = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar2,'\n');
  colourGuard.m_moved = false;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&lineInfo);
  std::operator<<((ostream *)os,'\n');
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000027f940 = 0x2e2e2e2e2e2e2e;
    uRam000000000027f947._0_1_ = '.';
    uRam000000000027f947._1_1_ = '.';
    uRam000000000027f947._2_1_ = '.';
    uRam000000000027f947._3_1_ = '.';
    uRam000000000027f947._4_1_ = '.';
    uRam000000000027f947._5_1_ = '.';
    uRam000000000027f947._6_1_ = '.';
    uRam000000000027f947._7_1_ = '.';
    DAT_0027f930 = '.';
    DAT_0027f930_1._0_1_ = '.';
    DAT_0027f930_1._1_1_ = '.';
    DAT_0027f930_1._2_1_ = '.';
    DAT_0027f930_1._3_1_ = '.';
    DAT_0027f930_1._4_1_ = '.';
    DAT_0027f930_1._5_1_ = '.';
    DAT_0027f930_1._6_1_ = '.';
    uRam000000000027f938 = 0x2e2e2e2e2e2e2e;
    DAT_0027f93f = 0x2e;
    DAT_0027f920 = '.';
    DAT_0027f920_1._0_1_ = '.';
    DAT_0027f920_1._1_1_ = '.';
    DAT_0027f920_1._2_1_ = '.';
    DAT_0027f920_1._3_1_ = '.';
    DAT_0027f920_1._4_1_ = '.';
    DAT_0027f920_1._5_1_ = '.';
    DAT_0027f920_1._6_1_ = '.';
    uRam000000000027f928._0_1_ = '.';
    uRam000000000027f928._1_1_ = '.';
    uRam000000000027f928._2_1_ = '.';
    uRam000000000027f928._3_1_ = '.';
    uRam000000000027f928._4_1_ = '.';
    uRam000000000027f928._5_1_ = '.';
    uRam000000000027f928._6_1_ = '.';
    uRam000000000027f928._7_1_ = '.';
    DAT_0027f910 = '.';
    DAT_0027f910_1._0_1_ = '.';
    DAT_0027f910_1._1_1_ = '.';
    DAT_0027f910_1._2_1_ = '.';
    DAT_0027f910_1._3_1_ = '.';
    DAT_0027f910_1._4_1_ = '.';
    DAT_0027f910_1._5_1_ = '.';
    DAT_0027f910_1._6_1_ = '.';
    uRam000000000027f918._0_1_ = '.';
    uRam000000000027f918._1_1_ = '.';
    uRam000000000027f918._2_1_ = '.';
    uRam000000000027f918._3_1_ = '.';
    uRam000000000027f918._4_1_ = '.';
    uRam000000000027f918._5_1_ = '.';
    uRam000000000027f918._6_1_ = '.';
    uRam000000000027f918._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000027f908._0_1_ = '.';
    uRam000000000027f908._1_1_ = '.';
    uRam000000000027f908._2_1_ = '.';
    uRam000000000027f908._3_1_ = '.';
    uRam000000000027f908._4_1_ = '.';
    uRam000000000027f908._5_1_ = '.';
    uRam000000000027f908._6_1_ = '.';
    uRam000000000027f908._7_1_ = '.';
    DAT_0027f94f = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  poVar2 = std::operator<<(poVar2,'\n');
  std::endl<char,std::char_traits<char>>(poVar2);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}